

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_reaction_diffusion_mri.c
# Opt level: O2

int main(void)

{
  int iVar1;
  undefined8 *__ptr;
  void *returnvalue;
  void *pvVar2;
  void *pvVar3;
  FILE *pFVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  int retval;
  SUNContext ctx;
  double local_70;
  MRIStepInnerStepper inner_stepper;
  void *local_60;
  sunrealtype t;
  sunrealtype local_50;
  ulong local_48;
  void *local_40;
  void *local_38;
  
  inner_stepper = (MRIStepInnerStepper)0x0;
  retval = SUNContext_Create(0,&ctx);
  iVar5 = 1;
  iVar1 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar1 == 0) {
    __ptr = (undefined8 *)malloc(0x20);
    *__ptr = 0x3e9;
    __ptr[1] = 0x3f747ae147ae147b;
    __ptr[2] = 0x3f847ae147ae147b;
    __ptr[3] = 0x401c48c6001f0ac0;
    puts("\n1D reaction-diffusion PDE test problem:");
    printf("  N = %li\n",0x3e9);
    printf("  diffusion coefficient:  k = %g\n",0x47ae147b);
    returnvalue = (void *)N_VNew_Serial(0x3e9,ctx);
    iVar1 = check_retval(returnvalue,"N_VNew_Serial",0);
    if (iVar1 == 0) {
      pvVar2 = (void *)N_VGetArrayPointer(returnvalue);
      iVar1 = check_retval(pvVar2,"N_VGetArrayPointer",0);
      if (iVar1 == 0) {
        iVar1 = 0;
        for (lVar6 = 0; lVar6 != 0x3e9; lVar6 = lVar6 + 1) {
          dVar9 = exp(((double)lVar6 * 0.005 + -1.0) * 7.0710678118654755);
          *(double *)((long)pvVar2 + lVar6 * 8) = 1.0 / (dVar9 + 1.0);
        }
      }
      else {
        iVar1 = -1;
      }
      iVar5 = 1;
      retval = iVar1;
      iVar1 = check_retval(&retval,"SetInitialCondition",1);
      if (iVar1 == 0) {
        pvVar2 = (void *)ARKStepCreate(0,ff,0,returnvalue,ctx);
        local_40 = pvVar2;
        iVar1 = check_retval(pvVar2,"ARKStepCreate",0);
        if (iVar1 == 0) {
          retval = ARKodeSetUserData(pvVar2,__ptr);
          iVar5 = 1;
          iVar1 = check_retval(&retval,"ARKodeSetUserData",1);
          if (iVar1 == 0) {
            retval = ARKStepSetTableNum(pvVar2,0xffffffffffffffff,0xc);
            iVar5 = 1;
            iVar1 = check_retval(&retval,"ARKStepSetTableNum",1);
            if (iVar1 == 0) {
              retval = ARKodeSetFixedStep(0x88e368f1,pvVar2);
              iVar5 = 1;
              iVar1 = check_retval(&retval,"ARKodeSetFixedStep",1);
              if (iVar1 == 0) {
                retval = ARKStepCreateMRIStepInnerStepper(pvVar2,&inner_stepper);
                iVar5 = 1;
                iVar1 = check_retval(&retval,"ARKStepCreateMRIStepInnerStepper",1);
                if (iVar1 == 0) {
                  pvVar3 = (void *)MRIStepCreate(0,fs,0,returnvalue,inner_stepper,ctx);
                  local_38 = pvVar3;
                  iVar1 = check_retval(pvVar3,"MRIStepCreate",0);
                  if (iVar1 == 0) {
                    retval = ARKodeSetUserData(pvVar3,__ptr);
                    iVar5 = 1;
                    iVar1 = check_retval(&retval,"ARKodeSetUserData",1);
                    if (iVar1 == 0) {
                      retval = ARKodeSetFixedStep(0xd2f1a9fc,pvVar3);
                      iVar5 = 1;
                      iVar1 = check_retval(&retval,"ARKodeSetFixedStep",1);
                      if (iVar1 == 0) {
                        retval = ARKodeSetMaxNumSteps(pvVar3,10000);
                        iVar5 = 1;
                        iVar1 = check_retval(&retval,"ARKodeSetMaxNumSteps",1);
                        if (iVar1 == 0) {
                          local_60 = pvVar3;
                          pFVar4 = fopen("heat_mesh.txt","w");
                          for (lVar6 = 0; lVar6 != 0x3e9; lVar6 = lVar6 + 1) {
                            fprintf(pFVar4,"  %.16e\n",SUB84((double)lVar6 * (double)__ptr[1],0));
                          }
                          fclose(pFVar4);
                          pFVar4 = fopen("heat1D.txt","w");
                          lVar6 = N_VGetArrayPointer(returnvalue);
                          for (lVar7 = 0; lVar7 != 0x3e9; lVar7 = lVar7 + 1) {
                            fprintf(pFVar4," %.16e",(int)*(undefined8 *)(lVar6 + lVar7 * 8));
                          }
                          fputc(10,pFVar4);
                          t = 0.0;
                          puts("        t      ||u||_rms");
                          puts("   -------------------------");
                          dVar9 = (double)N_VDotProd(returnvalue,returnvalue);
                          dVar9 = dVar9 / 1001.0;
                          if (dVar9 < 0.0) {
                            dVar9 = sqrt(dVar9);
                          }
                          else {
                            dVar9 = SQRT(dVar9);
                          }
                          printf("  %10.6f  %10.6f\n",0,dVar9);
                          local_70 = 0.1;
                          uVar8 = 0;
                          while ((int)uVar8 != 0x1e) {
                            retval = ARKodeEvolve(SUB84(local_70,0),local_60,returnvalue,&t,1);
                            iVar1 = check_retval(&retval,"ARKodeEvolve",1);
                            if (iVar1 != 0) break;
                            local_50 = t;
                            local_48 = uVar8;
                            dVar9 = (double)N_VDotProd(returnvalue,returnvalue);
                            dVar9 = dVar9 / 1001.0;
                            if (dVar9 < 0.0) {
                              dVar9 = sqrt(dVar9);
                            }
                            else {
                              dVar9 = SQRT(dVar9);
                            }
                            printf("  %10.6f  %10.6f\n",SUB84(local_50,0),dVar9);
                            for (lVar7 = 0; lVar7 != 0x3e9; lVar7 = lVar7 + 1) {
                              fprintf(pFVar4," %.16e",(int)*(undefined8 *)(lVar6 + lVar7 * 8));
                            }
                            fputc(10,pFVar4);
                            dVar9 = local_70 + 0.1;
                            local_70 = 3.0;
                            if (dVar9 <= 3.0) {
                              local_70 = dVar9;
                            }
                            uVar8 = (ulong)((int)local_48 + 1);
                          }
                          puts("   -------------------------");
                          fclose(pFVar4);
                          puts("\nFinal Slow Statistics:");
                          pvVar3 = local_60;
                          iVar5 = 0;
                          retval = ARKodePrintAllStats(local_60,_stdout,0);
                          puts("\nFinal Fast Statistics:");
                          retval = ARKodePrintAllStats(pvVar2,_stdout,0);
                          pFVar4 = fopen("ark_reaction_diffusion_mri_slow_stats.csv","w");
                          retval = ARKodePrintAllStats(pvVar3,pFVar4,1);
                          fclose(pFVar4);
                          pFVar4 = fopen("ark_reaction_diffusion_mri_fast_stats.csv","w");
                          retval = ARKodePrintAllStats(pvVar2,pFVar4,1);
                          fclose(pFVar4);
                          N_VDestroy(returnvalue);
                          ARKodeFree(&local_40);
                          MRIStepInnerStepper_Free(&inner_stepper);
                          ARKodeFree(&local_38);
                          free(__ptr);
                          SUNContext_Free(&ctx);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0    = SUN_RCONST(0.0);       /* initial time */
  sunrealtype Tf    = SUN_RCONST(3.0);       /* final time */
  sunrealtype dTout = SUN_RCONST(0.1);       /* time between outputs */
  int Nt            = (int)ceil(Tf / dTout); /* number of output times */
  sunrealtype hs    = SUN_RCONST(0.001);     /* slow step size */
  sunrealtype hf    = SUN_RCONST(0.00002);   /* fast step size */
  UserData udata    = NULL;                  /* user data */

  sunrealtype* data;                /* array for solution output */
  sunrealtype L  = SUN_RCONST(5.0); /* domain length */
  sunindextype N = 1001;            /* number of mesh points */
  sunrealtype ep = SUN_RCONST(1e-2);
  sunindextype i;

  /* general problem variables */
  int retval;                    /* reusable error-checking flag */
  N_Vector y             = NULL; /* empty vector for storing solution */
  void* arkode_mem       = NULL; /* empty ARKode memory structure */
  void* inner_arkode_mem = NULL; /* empty ARKode memory structure */
  MRIStepInnerStepper inner_stepper = NULL; /* inner stepper */
  FILE *FID, *UFID;
  sunrealtype t, tout;
  int iout;

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /*
   * Initialization
   */

  /* allocate and fill user data structure */
  udata      = (UserData)malloc(sizeof(*udata));
  udata->N   = N;
  udata->dx  = L / (SUN_RCONST(1.0) * N - SUN_RCONST(1.0));
  udata->k   = SUN_RCONST(1e-4) / ep;
  udata->lam = SUN_RCONST(0.5) * sqrt(SUN_RCONST(2.0) * ep * SUN_RCONST(1e4));

  /* Initial problem output */
  printf("\n1D reaction-diffusion PDE test problem:\n");
  printf("  N = %li\n", (long int)udata->N);
  printf("  diffusion coefficient:  k = %" GSYM "\n", udata->k);

  /* Create and initialize serial vector for the solution */
  y = N_VNew_Serial(N, ctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return 1; }

  retval = SetInitialCondition(y, udata);
  if (check_retval(&retval, "SetInitialCondition", 1)) { return 1; }

  /*
   * Create the slow integrator and set options
   */

  /* Initialize the fast integrator. Specify the explicit fast right-hand side
     function in y'=fe(t,y)+fi(t,y)+ff(t,y), the inital time T0, and the
     initial dependent variable vector y. */
  inner_arkode_mem = ARKStepCreate(ff, NULL, T0, y, ctx);
  if (check_retval((void*)inner_arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Attach user data to fast integrator */
  retval = ARKodeSetUserData(inner_arkode_mem, (void*)udata);
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

  /* Set the fast method */
  retval = ARKStepSetTableNum(inner_arkode_mem, -1, ARKODE_KNOTH_WOLKE_3_3);
  if (check_retval(&retval, "ARKStepSetTableNum", 1)) { return 1; }

  /* Set the fast step size */
  retval = ARKodeSetFixedStep(inner_arkode_mem, hf);
  if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

  /* Create inner stepper */
  retval = ARKStepCreateMRIStepInnerStepper(inner_arkode_mem, &inner_stepper);
  if (check_retval(&retval, "ARKStepCreateMRIStepInnerStepper", 1))
  {
    return 1;
  }

  /*
   * Create the slow integrator and set options
   */

  /* Initialize the slow integrator. Specify the explicit slow right-hand side
     function in y'=fe(t,y)+fi(t,y)+ff(t,y), the inital time T0, the
     initial dependent variable vector y, and the fast integrator. */
  arkode_mem = MRIStepCreate(fs, NULL, T0, y, inner_stepper, ctx);
  if (check_retval((void*)arkode_mem, "MRIStepCreate", 0)) { return 1; }

  /* Pass udata to user functions */
  retval = ARKodeSetUserData(arkode_mem, (void*)udata);
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

  /* Set the slow step size */
  retval = ARKodeSetFixedStep(arkode_mem, hs);
  if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

  /* Increase max num steps  */
  retval = ARKodeSetMaxNumSteps(arkode_mem, 10000);
  if (check_retval(&retval, "ARKodeSetMaxNumSteps", 1)) { return 1; }

  /*
   * Integrate ODE
   */

  /* output mesh to disk */
  FID = fopen("heat_mesh.txt", "w");
  for (i = 0; i < N; i++) { fprintf(FID, "  %.16" ESYM "\n", udata->dx * i); }
  fclose(FID);

  /* Open output stream for results, access data array */
  UFID = fopen("heat1D.txt", "w");
  data = N_VGetArrayPointer(y);

  /* output initial condition to disk */
  for (i = 0; i < N; i++) { fprintf(UFID, " %.16" ESYM "", data[i]); }
  fprintf(UFID, "\n");

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results. Stops when the final time has been reached */
  t     = T0;
  dTout = (Tf - T0) / Nt;
  tout  = T0 + dTout;
  printf("        t      ||u||_rms\n");
  printf("   -------------------------\n");
  printf("  %10.6" FSYM "  %10.6f\n", t, sqrt(N_VDotProd(y, y) / N));
  for (iout = 0; iout < Nt; iout++)
  {
    /* call integrator */
    retval = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL);
    if (check_retval(&retval, "ARKodeEvolve", 1)) { break; }

    /* print solution stats and output results to disk */
    printf("  %10.6" FSYM "  %10.6f\n", t, sqrt(N_VDotProd(y, y) / N));
    for (i = 0; i < N; i++) { fprintf(UFID, " %.16" ESYM "", data[i]); }
    fprintf(UFID, "\n");

    /* successful solve: update output time */
    tout += dTout;
    tout = (tout > Tf) ? Tf : tout;
  }
  printf("   -------------------------\n");
  fclose(UFID);

  /* Print final statistics to the screen */
  printf("\nFinal Slow Statistics:\n");
  retval = ARKodePrintAllStats(arkode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);
  printf("\nFinal Fast Statistics:\n");
  retval = ARKodePrintAllStats(inner_arkode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  FID    = fopen("ark_reaction_diffusion_mri_slow_stats.csv", "w");
  retval = ARKodePrintAllStats(arkode_mem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);
  FID    = fopen("ark_reaction_diffusion_mri_fast_stats.csv", "w");
  retval = ARKodePrintAllStats(inner_arkode_mem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Clean up and return */
  N_VDestroy(y);                            /* Free y vector */
  ARKodeFree(&inner_arkode_mem);            /* Free integrator memory */
  MRIStepInnerStepper_Free(&inner_stepper); /* Free inner stepper */
  ARKodeFree(&arkode_mem);                  /* Free integrator memory */
  free(udata);                              /* Free user data */
  SUNContext_Free(&ctx);                    /* Free context */

  return 0;
}